

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderAlgorithmTests.cpp
# Opt level: O0

ShaderAlgorithmCase *
deqp::gles2::Functional::createExpressionCase
          (Context *context,char *caseName,char *description,bool isVertexCase,
          ShaderEvalFunc evalFunc,LineStream *shaderBody)

{
  size_t sVar1;
  char *pcVar2;
  ShaderAlgorithmCase *this;
  char *fragShaderSource;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var3;
  undefined1 *local_4d8;
  undefined1 local_4d0 [8];
  string fragmentShaderSource;
  string vertexShaderSource;
  string local_488 [32];
  string local_468;
  undefined1 local_448 [8];
  StringTemplate fragTemplate;
  string local_420 [32];
  string local_400;
  undefined1 local_3e0 [8];
  StringTemplate vertTemplate;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  undefined1 local_370 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  ostringstream *op;
  undefined1 local_328 [8];
  ostringstream frag;
  ostringstream vtx;
  LineStream *shaderBody_local;
  ShaderEvalFunc evalFunc_local;
  bool isVertexCase_local;
  char *description_local;
  char *caseName_local;
  Context *context_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
  if (isVertexCase) {
    local_4d8 = &frag.field_0x170;
  }
  else {
    local_4d8 = local_328;
  }
  params._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_4d8;
  std::operator<<((ostream *)&frag.field_0x170,"attribute highp vec4 a_position;\n");
  std::operator<<((ostream *)&frag.field_0x170,"attribute highp vec4 a_unitCoords;\n");
  if (isVertexCase) {
    std::operator<<((ostream *)&frag.field_0x170,"varying mediump vec3 v_color;\n");
    std::operator<<((ostream *)local_328,"varying mediump vec3 v_color;\n");
  }
  else {
    std::operator<<((ostream *)&frag.field_0x170,"varying mediump vec4 v_coords;\n");
    std::operator<<((ostream *)local_328,"varying mediump vec4 v_coords;\n");
  }
  std::operator<<((ostream *)&frag.field_0x170,"\n");
  std::operator<<((ostream *)&frag.field_0x170,"void main()\n");
  std::operator<<((ostream *)&frag.field_0x170,"{\n");
  std::operator<<((ostream *)&frag.field_0x170,"\tgl_Position = a_position;\n");
  std::operator<<((ostream *)local_328,"\n");
  std::operator<<((ostream *)local_328,"void main()\n");
  std::operator<<((ostream *)local_328,"{\n");
  if (isVertexCase) {
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\t${PRECISION} vec4 coords = a_unitCoords;\n");
  }
  else {
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\t${PRECISION} vec4 coords = v_coords;\n");
  }
  std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  "\t${PRECISION} vec3 res = vec3(0.0);\n");
  sVar1 = params._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pcVar2 = deqp::gls::LineStream::str(shaderBody);
  std::operator<<((ostream *)sVar1,pcVar2);
  if (isVertexCase) {
    std::operator<<((ostream *)&frag.field_0x170,"\tv_color = res;\n");
    std::operator<<((ostream *)local_328,"\tgl_FragColor = vec4(v_color, 1.0);\n");
  }
  else {
    std::operator<<((ostream *)&frag.field_0x170,"\tv_coords = a_unitCoords;\n");
    std::operator<<((ostream *)local_328,"\tgl_FragColor = vec4(res, 1.0);\n");
  }
  std::operator<<((ostream *)&frag.field_0x170,"}\n");
  std::operator<<((ostream *)local_328,"}\n");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_370);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
            (&local_3b0,(char (*) [10])0x2c5cf43,(char (*) [8])0x2b6de4a);
  _Var3 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_370,&local_3b0);
  vertTemplate.m_template.field_2._8_8_ = _Var3.first._M_node;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_3b0);
  std::__cxx11::ostringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,pcVar2,
             (allocator<char> *)(fragTemplate.m_template.field_2._M_local_buf + 0xf));
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_3e0,&local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator
            ((allocator<char> *)(fragTemplate.m_template.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string(local_420);
  std::__cxx11::ostringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,pcVar2,
             (allocator<char> *)(vertexShaderSource.field_2._M_local_buf + 0xf));
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_448,&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator
            ((allocator<char> *)(vertexShaderSource.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string(local_488);
  tcu::StringTemplate::specialize
            ((string *)((long)&fragmentShaderSource.field_2 + 8),(StringTemplate *)local_3e0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_370);
  tcu::StringTemplate::specialize
            ((string *)local_4d0,(StringTemplate *)local_448,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_370);
  this = (ShaderAlgorithmCase *)operator_new(0x128);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  fragShaderSource = (char *)std::__cxx11::string::c_str();
  ShaderAlgorithmCase::ShaderAlgorithmCase
            (this,context,caseName,description,isVertexCase,evalFunc,pcVar2,fragShaderSource);
  std::__cxx11::string::~string((string *)local_4d0);
  std::__cxx11::string::~string((string *)(fragmentShaderSource.field_2._M_local_buf + 8));
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_448);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_3e0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_370);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag.field_0x170);
  return this;
}

Assistant:

static ShaderAlgorithmCase* createExpressionCase (Context& context, const char* caseName, const char* description, bool isVertexCase, ShaderEvalFunc evalFunc, LineStream& shaderBody)
{
	std::ostringstream vtx;
	std::ostringstream frag;
	std::ostringstream& op = isVertexCase ? vtx : frag;

	vtx << "attribute highp vec4 a_position;\n";
	vtx << "attribute highp vec4 a_unitCoords;\n";

	if (isVertexCase)
	{
		vtx << "varying mediump vec3 v_color;\n";
		frag << "varying mediump vec3 v_color;\n";
	}
	else
	{
		vtx << "varying mediump vec4 v_coords;\n";
		frag << "varying mediump vec4 v_coords;\n";
	}

//	op << "uniform mediump sampler2D ut_brick;\n";

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	// Write matrix.
	if (isVertexCase)
		op << "	${PRECISION} vec4 coords = a_unitCoords;\n";
	else
		op << "	${PRECISION} vec4 coords = v_coords;\n";

	op << "	${PRECISION} vec3 res = vec3(0.0);\n";
	op << shaderBody.str();

	if (isVertexCase)
	{
		vtx << "	v_color = res;\n";
		frag << "	gl_FragColor = vec4(v_color, 1.0);\n";
	}
	else
	{
		vtx << "	v_coords = a_unitCoords;\n";
		frag << "	gl_FragColor = vec4(res, 1.0);\n";
	}

	vtx << "}\n";
	frag << "}\n";

	// Fill in shader templates.
	map<string, string> params;
	params.insert(pair<string, string>("PRECISION", "mediump"));

	StringTemplate vertTemplate(vtx.str().c_str());
	StringTemplate fragTemplate(frag.str().c_str());
	string vertexShaderSource = vertTemplate.specialize(params);
	string fragmentShaderSource = fragTemplate.specialize(params);

	return new ShaderAlgorithmCase(context, caseName, description, isVertexCase, evalFunc, vertexShaderSource.c_str(), fragmentShaderSource.c_str());
}